

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O1

void __thiscall SongListModel::moveDown(SongListModel *this,int index)

{
  char16_t **ppcVar1;
  char16_t **ppcVar2;
  bool bVar3;
  pointer pSVar4;
  undefined8 uVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  Module *this_00;
  SongList *this_01;
  PermanentEditor editor;
  PermanentEditor local_40;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  local_40.super_Editor.super_QMutexLocker<QMutex>.m = (QMutex *)0xffffffffffffffff;
  local_40.super_Editor.super_QMutexLocker<QMutex>.isLocked = false;
  local_40.super_Editor.super_QMutexLocker<QMutex>._9_7_ = 0;
  local_40.mModule = (Module *)0x0;
  local_28 = 0xffffffffffffffff;
  local_20 = 0;
  uStack_18 = 0;
  QAbstractItemModel::beginMoveRows
            ((QModelIndex *)this,(int)&local_40,index,(QModelIndex *)(ulong)(uint)index,
             (int)&local_28);
  Module::permanentEdit(&local_40,this->mModule);
  this_00 = Module::data(this->mModule);
  this_01 = trackerboy::Module::songs(this_00);
  trackerboy::SongList::moveDown(this_01,index);
  Module::PermanentEditor::~PermanentEditor(&local_40);
  pSVar4 = (this->mSongData).
           super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = pSVar4[index].name.d.d;
  ppcVar1 = &pSVar4[index].name.d.ptr;
  pcVar6 = *ppcVar1;
  qVar7 = (qsizetype)ppcVar1[1];
  bVar3 = pSVar4[index].shouldCommit;
  pSVar4[index].name.d.d = pSVar4[(long)index + 1].name.d.d;
  ppcVar1 = &pSVar4[(long)index + 1].name.d.ptr;
  qVar8 = (qsizetype)ppcVar1[1];
  ppcVar2 = &pSVar4[index].name.d.ptr;
  *ppcVar2 = *ppcVar1;
  ppcVar2[1] = (char16_t *)qVar8;
  pSVar4[index].shouldCommit = pSVar4[(long)index + 1].shouldCommit;
  pSVar4[(long)index + 1].name.d.d = (Data *)uVar5;
  ppcVar1 = &pSVar4[(long)index + 1].name.d.ptr;
  *ppcVar1 = pcVar6;
  ppcVar1[1] = (char16_t *)qVar7;
  pSVar4[(long)index + 1].shouldCommit = bVar3;
  QAbstractItemModel::endMoveRows();
  return;
}

Assistant:

void SongListModel::moveDown(int index) {
    // the + 2 is correct, qt is weird
    beginMoveRows(QModelIndex(), index, index, QModelIndex(), index + 2);
    {
        auto editor = mModule.permanentEdit();
        mModule.data().songs().moveDown(index);
    }

    auto iter = mSongData.begin() + index;
    std::iter_swap(iter, iter + 1);

    endMoveRows();
}